

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

any * __thiscall
Omega_h::SemicolonOp::eval(any *__return_storage_ptr__,SemicolonOp *this,ExprEnv *env)

{
  element_type *peVar1;
  any local_38;
  ExprEnv *local_20;
  ExprEnv *env_local;
  SemicolonOp *this_local;
  
  local_20 = env;
  env_local = (ExprEnv *)this;
  this_local = (SemicolonOp *)__return_storage_ptr__;
  peVar1 = std::__shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->lhs);
  (*peVar1->_vptr_ExprOp[2])(&local_38,peVar1,local_20);
  any::~any(&local_38);
  peVar1 = std::__shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->rhs);
  (*peVar1->_vptr_ExprOp[2])(__return_storage_ptr__,peVar1,local_20);
  return __return_storage_ptr__;
}

Assistant:

any SemicolonOp::eval(ExprEnv& env) {
  lhs->eval(env);  // LHS result ignored
  return rhs->eval(env);
}